

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

TCGLabel * gen_jz_ecx_string(DisasContext *s,target_ulong next_eip)

{
  MemOp size;
  TCGContext *s_00;
  TCGContext *tcg_ctx;
  TCGLabel *l;
  TCGLabel *a1;
  uintptr_t o_1;
  uintptr_t o;
  
  s_00 = s->uc->tcg_ctx;
  l = gen_new_label_x86_64(s_00);
  a1 = gen_new_label_x86_64(s_00);
  size = s->aflag;
  tcg_ctx = s->uc->tcg_ctx;
  if (s->tmp0 != tcg_ctx->cpu_regs[1]) {
    tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(s->tmp0 + (long)tcg_ctx),
                       (TCGArg)(tcg_ctx->cpu_regs[1] + (long)tcg_ctx));
  }
  gen_ext_tl(tcg_ctx,s->tmp0,s->tmp0,size,false);
  tcg_gen_brcondi_i64_x86_64(tcg_ctx,TCG_COND_NE,s->tmp0,0,l);
  *(byte *)a1 = *(byte *)a1 | 1;
  tcg_gen_op1_x86_64(s_00,INDEX_op_set_label,(TCGArg)a1);
  gen_jmp_tb(s,next_eip,1);
  *(byte *)l = *(byte *)l | 1;
  tcg_gen_op1_x86_64(s_00,INDEX_op_set_label,(TCGArg)l);
  return a1;
}

Assistant:

static TCGLabel *gen_jz_ecx_string(DisasContext *s, target_ulong next_eip)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGLabel *l2 = gen_new_label(tcg_ctx);
    gen_op_jnz_ecx(s, s->aflag, l1);
    gen_set_label(tcg_ctx, l2);
    gen_jmp_tb(s, next_eip, 1);
    gen_set_label(tcg_ctx, l1);
    return l2;
}